

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.hpp
# Opt level: O2

bool __thiscall
OpenMD::FragmentStamp::
addIndexSensitiveStamp<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>,OpenMD::RigidBodyStamp>
          (FragmentStamp *this,
          vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *cont,
          RigidBodyStamp *stamp)

{
  pointer ppRVar1;
  const_iterator __position;
  ulong uVar2;
  ulong uVar3;
  value_type local_20;
  
  uVar3 = (ulong)(uint)stamp->index_;
  ppRVar1 = (cont->
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (cont->
       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current - (long)ppRVar1 >> 3;
  if (uVar2 < stamp->index_ + 1) {
    local_20 = (value_type)0x0;
    std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::insert
              (cont,__position,(uVar3 - uVar2) + 1,&local_20);
    ppRVar1 = (cont->
              super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  else if (ppRVar1[uVar3] != (RigidBodyStamp *)0x0) {
    return false;
  }
  ppRVar1[uVar3] = stamp;
  return true;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }